

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

void EVP_HPKE_KEY_move(EVP_HPKE_KEY *out,EVP_HPKE_KEY *in)

{
  EVP_HPKE_KEY *in_local;
  EVP_HPKE_KEY *out_local;
  
  EVP_HPKE_KEY_cleanup(out);
  OPENSSL_memcpy(out,in,0x70);
  EVP_HPKE_KEY_zero(in);
  return;
}

Assistant:

void EVP_HPKE_KEY_move(EVP_HPKE_KEY *out, EVP_HPKE_KEY *in) {
  EVP_HPKE_KEY_cleanup(out);
  // For now, |EVP_HPKE_KEY| is trivially movable.
  // Note that Rust may move this structure. See
  // bssl-crypto/src/scoped.rs:EvpHpkeKey.
  OPENSSL_memcpy(out, in, sizeof(EVP_HPKE_KEY));
  EVP_HPKE_KEY_zero(in);
}